

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O1

int launch(nvamemtiming_conf *conf,FILE *outf,uint8_t progression,color color)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint uVar4;
  __time_t _Var5;
  __time_t _Var6;
  int iVar7;
  __pid_t _Var8;
  int extraout_EAX;
  uint uVar9;
  Display *dpy;
  FILE *pFVar10;
  undefined7 in_register_00000011;
  undefined1 *ref_val;
  char *pcVar11;
  Display *pDVar12;
  uint32_t reg;
  uint32_t regs_len;
  ulong uVar13;
  nvamemtiming_conf *pnVar14;
  color color_00;
  bool bVar15;
  int cur_perflvl;
  timeval tv;
  char acStackY_100 [32];
  code *pcStackY_e0;
  uint local_c0;
  uint local_bc;
  nvamemtiming_conf *local_b8;
  color local_ac;
  uint local_a8;
  int local_a4;
  FILE *local_a0;
  timeval local_98 [6];
  
  pcStackY_e0 = (code *)0x10443b;
  printf("--- Start sequence number %u\n",CONCAT71(in_register_00000011,progression) & 0xffffffff);
  pcStackY_e0 = (code *)0x104447;
  iVar7 = system("rmmod nvidia");
  if (iVar7 == 0x7f) {
    pcStackY_e0 = (code *)0x104a77;
    launch_cold_15();
LAB_00104a77:
    pcStackY_e0 = (code *)0x104a7c;
    launch_cold_1();
LAB_00104a7c:
    pcStackY_e0 = (code *)0x104a81;
    launch_cold_7();
LAB_00104a81:
    pcStackY_e0 = (code *)0x104a86;
    launch_cold_6();
  }
  else {
    pcStackY_e0 = (code *)0x104460;
    iVar7 = vbios_upload_pramin(conf->cnum,(conf->vbios).data,(int)(conf->vbios).length);
    if (iVar7 != 1) goto LAB_00104a77;
    pcStackY_e0 = (code *)0x104481;
    setenv("DISPLAY",":0",1);
    if (conf->mmiotrace != true) {
LAB_0010453a:
      pcStackY_e0 = (code *)0x10453f;
      _Var8 = fork();
      if (_Var8 != -1) {
        if (_Var8 != 0) {
          local_a8 = (uint)(conf->timing).perflvl;
          local_bc = CONCAT31(local_bc._1_3_,conf->mmiotrace);
          uVar9 = 0;
          do {
            pcStackY_e0 = (code *)0x10456d;
            usleep(10000);
            pcStackY_e0 = (code *)0x104574;
            dpy = (Display *)XOpenDisplay(0);
            if (dpy != (Display *)0x0) break;
            bVar15 = uVar9 < 199;
            uVar9 = uVar9 + 1;
          } while (bVar15);
          pcStackY_e0 = (code *)0x1045a9;
          fwrite("-- Display opened\n",0x12,1,_stderr);
          if (dpy == (Display *)0x0) {
            pcStackY_e0 = (code *)0x1045b3;
            launch_cold_14();
            return extraout_EAX;
          }
          local_c0 = 0xffffffff;
          pcStackY_e0 = (code *)0x1045e1;
          local_ac = color;
          local_a0 = (FILE *)outf;
          gettimeofday(local_98,(__timezone_ptr_t)0x0);
          _Var5 = local_98[0].tv_sec;
          pcStackY_e0 = (code *)0x1045fc;
          pDVar12 = dpy;
          XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,(int *)&local_c0);
          pcStackY_e0 = (code *)0x104601;
          _Var8 = fork();
          if (_Var8 == -1) {
            pcStackY_e0 = shallow_dump;
            launch_cold_8();
            pcStackY_e0 = (code *)_Var5;
            bVar1 = *(byte *)((long)&pDVar12->free_funcs + 4);
            if ((bVar1 == 0xff) || (*(char *)((long)&pDVar12->free_funcs + 5) == -1)) {
              sprintf(acStackY_100,"regs_timing_%i_%i",(ulong)bVar1,
                      (ulong)*(byte *)((long)&pDVar12->free_funcs + 5));
            }
            else {
              builtin_strncpy(acStackY_100,"regs_timing",0xc);
            }
            pFVar10 = fopen(acStackY_100,"wb");
            if (pFVar10 != (FILE *)0x0) {
              shallow_dump_cold_1();
            }
            else {
              perror("Open regs_timing");
            }
            return (uint)(pFVar10 == (FILE *)0x0);
          }
          local_b8 = conf;
          if (_Var8 != 0) {
            pcStackY_e0 = (code *)0x104624;
            sleep(1);
            do {
              pcStackY_e0 = (code *)0x10463c;
              usleep(10000);
              pcStackY_e0 = (code *)0x104646;
              gettimeofday(local_98,(__timezone_ptr_t)0x0);
              _Var6 = local_98[0].tv_sec;
              pcStackY_e0 = (code *)0x104662;
              XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x107,&local_a4);
              if (local_a4 == 1) break;
            } while (_Var5 + 2U < (ulong)_Var6);
            pcStackY_e0 = (code *)0x10467b;
            kill(_Var8,0xf);
            pcStackY_e0 = (code *)0x104687;
            waitpid(_Var8,(int *)0x0,0);
            uVar13 = CONCAT71((uint7)(uint3)((uint)_Var8 >> 8),1);
            if ((char)local_bc != '\0') {
              pcStackY_e0 = (code *)0x1046a4;
              iVar7 = write_to_file("/sys/kernel/debug/tracing/trace_marker","Start downclocking\n")
              ;
              if (iVar7 != 0) {
                pcStackY_e0 = (code *)0x1046ad;
                launch_cold_9();
                uVar13 = 0;
              }
            }
            pcStackY_e0 = (code *)0x1046bf;
            gettimeofday(local_98,(__timezone_ptr_t)0x0);
            _Var5 = local_98[0].tv_sec;
            pcStackY_e0 = (code *)0x1046e2;
            fwrite("XNVCTRLQueryTargetAttribute\n",0x1c,1,_stderr);
            pcStackY_e0 = (code *)0x104701;
            XNVCTRLQueryTargetAttribute(dpy,1,0,0,0x10a,(int *)&local_c0);
            if (local_c0 == 1) {
              local_bc = (uint)uVar13;
              uVar9 = 0xffffffff;
              do {
                pcStackY_e0 = (code *)0x10472e;
                gettimeofday(local_98,(__timezone_ptr_t)0x0);
                if (_Var5 + 0x3cU < (ulong)local_98[0].tv_sec) {
                  pcStackY_e0 = (code *)0x10479a;
                  launch_cold_12();
                  uVar13 = (ulong)local_bc;
                  goto LAB_001047a8;
                }
                pcStackY_e0 = (code *)0x10474c;
                XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,(int *)&local_c0);
                uVar4 = local_c0;
                pcVar11 = "NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n";
                if (((int)uVar9 < 0) ||
                   (pcVar11 = "Changed NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n",
                   local_c0 != uVar9)) {
                  pcStackY_e0 = (code *)0x104780;
                  fprintf(_stderr,pcVar11,(ulong)local_c0);
                  uVar9 = uVar4;
                }
              } while (uVar9 != local_a8);
              pcStackY_e0 = (code *)0x1047f8;
              launch_cold_11();
              pnVar14 = local_b8;
            }
            else {
              pcStackY_e0 = (code *)0x10478a;
              launch_cold_10();
LAB_001047a8:
              pnVar14 = local_b8;
              pcStackY_e0 = (code *)0x1047b2;
              sleep(1);
              pcStackY_e0 = (code *)0x1047ba;
              XCloseDisplay(dpy);
              pFVar10 = _stderr;
              pcStackY_e0 = (code *)0x1047c9;
              uVar9 = getpid();
              pcStackY_e0 = (code *)0x1047dc;
              iVar7 = fprintf(pFVar10,"-- Display closed (pid = %i)\n",(ulong)uVar9);
              if ((char)uVar13 == '\0') {
                return iVar7;
              }
            }
            if (pnVar14->mmiotrace == true) {
              pcStackY_e0 = (code *)0x10481b;
              iVar7 = write_to_file("/sys/kernel/debug/tracing/current_tracer","nop");
              if (iVar7 != 0) {
                pcStackY_e0 = (code *)0x104a6d;
                launch_cold_13();
              }
              pcStackY_e0 = (code *)0x10482f;
              puts("mmiotrace stopped");
            }
            pFVar10 = local_a0;
            uVar2 = (pnVar14->vbios).timing_entry_offset;
            puVar3 = (pnVar14->vbios).data;
            pcStackY_e0 = (code *)0x10485a;
            fprintf(local_a0,"timing entry [%u/%u]: ",(ulong)(uint)(int)(char)progression,
                    (ulong)(pnVar14->vbios).timing_entry_length);
            if ((pnVar14->vbios).timing_entry_length != 0) {
              uVar13 = 0;
              do {
                pcVar11 = "%02x ";
                if ((int)(char)progression - 1 == uVar13) {
                  pcVar11 = "\x1b[0;31m%02x\x1b[0m ";
                }
                pcStackY_e0 = (code *)0x10488f;
                fprintf(pFVar10,pcVar11,(ulong)puVar3[uVar13 + uVar2]);
                uVar13 = uVar13 + 1;
              } while (uVar13 < (pnVar14->vbios).timing_entry_length);
            }
            pcStackY_e0 = (code *)0x1048a9;
            fputc(10,pFVar10);
            iVar7 = pnVar14->cnum;
            bVar15 = '\0' < (char)progression && local_ac != NO_COLOR;
            if ((nva_cards[iVar7]->chipset).card_type < 0xc0) {
              color_00 = (color)bVar15;
              pcStackY_e0 = (code *)0x10499d;
              dump_regs(iVar7,(FILE *)pFVar10,(uint32_t *)dump_timings_ref_val1,
                        (uint)dump_timings_ref_exist,0x100220,0x30,color_00);
              pcStackY_e0 = (code *)0x1049c5;
              dump_regs(pnVar14->cnum,(FILE *)pFVar10,(uint32_t *)dump_timings_ref_val2,
                        (uint)dump_timings_ref_exist,0x1002c0,0x30,color_00);
              pcStackY_e0 = (code *)0x1049ed;
              dump_regs(pnVar14->cnum,(FILE *)pFVar10,(uint32_t *)dump_timings_ref_val3,
                        (uint)dump_timings_ref_exist,0x100510,0x10,color_00);
              iVar7 = pnVar14->cnum;
              ref_val = dump_timings_ref_val4;
              reg = 0x100710;
              regs_len = 0x10;
            }
            else {
              pcStackY_e0 = (code *)0x104906;
              dump_regs(iVar7,(FILE *)pFVar10,(uint32_t *)dump_timings_ref_val3,
                        (uint)dump_timings_ref_exist,0x10f240,0x20,(uint)bVar15);
              pcStackY_e0 = (code *)0x10492e;
              dump_regs(pnVar14->cnum,(FILE *)pFVar10,(uint32_t *)dump_timings_ref_val1,
                        (uint)dump_timings_ref_exist,0x10f290,0xa0,(uint)bVar15);
              pcStackY_e0 = (code *)0x104956;
              dump_regs(pnVar14->cnum,(FILE *)pFVar10,(uint32_t *)dump_timings_ref_val4,
                        (uint)dump_timings_ref_exist,0x10f610,0x10,(uint)bVar15);
              iVar7 = pnVar14->cnum;
              ref_val = dump_timings_ref_val2;
              reg = 0x10f720;
              regs_len = 0x20;
            }
            pcStackY_e0 = (code *)0x104a15;
            dump_regs(iVar7,(FILE *)pFVar10,(uint32_t *)ref_val,(uint)dump_timings_ref_exist,reg,
                      regs_len,(uint)bVar15);
            pcStackY_e0 = (code *)0x104a22;
            fputc(10,pFVar10);
            pcStackY_e0 = (code *)0x104a2a;
            fflush(pFVar10);
            dump_timings_ref_exist = 1;
            pcStackY_e0 = (code *)0x104a3d;
            system("killall X");
            do {
              pcStackY_e0 = (code *)0x104a44;
              _Var8 = wait((void *)0x0);
            } while (0 < _Var8);
            pnVar14->counter = pnVar14->counter + 1;
            pcStackY_e0 = (code *)0x104a56;
            uVar9 = sleep(5);
            return uVar9;
          }
          pcVar11 = "timeout 3 glxgears";
          goto LAB_00104aaf;
        }
        goto LAB_00104a7c;
      }
      goto LAB_00104a81;
    }
    pcStackY_e0 = (code *)0x1044a7;
    iVar7 = mount("debugfs","/sys/kernel/debug","debugfs",0,(void *)0x0);
    if (iVar7 != 0) {
      pcStackY_e0 = (code *)0x1044b6;
      launch_cold_2();
    }
    pcStackY_e0 = (code *)0x1044c9;
    iVar7 = write_to_file("/sys/kernel/debug/tracing/buffer_size_kb","128000");
    if (iVar7 != 0) {
      pcStackY_e0 = (code *)0x1044d5;
      launch_cold_3();
    }
    pcStackY_e0 = (code *)0x1044e8;
    iVar7 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
    if (iVar7 != 0) {
      pcStackY_e0 = (code *)0x1044f4;
      launch_cold_4();
    }
    pcStackY_e0 = (code *)0x104507;
    iVar7 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
    if (iVar7 != 0) {
      pcStackY_e0 = (code *)0x104513;
      launch_cold_5();
    }
    pcStackY_e0 = (code *)0x104518;
    _Var8 = fork();
    if (_Var8 != 0) {
      if (_Var8 < 0) {
        pcStackY_e0 = (code *)0x10452e;
        perror("fork");
      }
      pcStackY_e0 = (code *)0x10453a;
      puts("mmiotrace started");
      goto LAB_0010453a;
    }
  }
  pcVar11 = (char *)local_98;
  pcStackY_e0 = (code *)0x104aa3;
  snprintf(pcVar11,100,"cat /sys/kernel/debug/tracing/trace_pipe > mmt_entry_%i",
           CONCAT71(in_register_00000011,progression) & 0xffffffff);
LAB_00104aaf:
  pcStackY_e0 = (code *)0x104ab4;
  iVar7 = system(pcVar11);
  pcStackY_e0 = (code *)0x104abb;
  exit(iVar7);
}

Assistant:

static int
launch(struct nvamemtiming_conf *conf, FILE *outf, uint8_t progression, enum color color)
{
	printf("--- Start sequence number %u\n", progression);

	if (system("rmmod nvidia") == 127)
	{
		fprintf(stderr, "rmmod not found. Abort\n");
		exit (2);
	}

	if (vbios_upload_pramin(conf->cnum, conf->vbios.data, conf->vbios.length) != 1)
	{
		fprintf(stderr, "upload failed. Abort\n");
		exit(3);
	}

	/* modify our env so as we can launch apps on X */
	setenv("DISPLAY", ":0", 1);

	/* monitor downclocking */
	if (conf->mmiotrace)
		mmiotrace_start(progression);

	pid_t pid = fork();
	if (pid == 0) {
		system("killall X 2> /dev/null > /dev/null");
		system("X > /dev/null 2> /dev/null");
		fprintf(stderr, "X exited, let's quit!\n");
		exit(0);
	} else if (pid == -1) {
		fprintf(stderr, "Fork failed! Abort\n");
		exit (4);
	}

	/* X runs, wait for the right perflvl to be selected */
	if (force_timing_changes(conf->timing.perflvl, conf->mmiotrace))
		return 1;

	if (conf->mmiotrace)
                mmiotrace_stop();

	dump_timings(conf, outf, progression, color);

	system("killall X");

	/* wait for all zombie processes */
	while(wait(NULL) > 0);

	/* increase the launch counter */
	conf->counter++;

	/* wait for the nvidia driver to modeset back to the crappy resolution */
	sleep(5);

	return 0;
}